

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O2

void __thiscall ASectorAction::Destroy(ASectorAction *this)

{
  sector_t *psVar1;
  AActor *pAVar2;
  TObjPtr<AActor> TVar3;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *obj;
  
  psVar1 = (this->super_AActor).Sector;
  if (psVar1 != (sector_t *)0x0) {
    pAVar2 = &GC::ReadBarrier<ASectorAction>((ASectorAction **)&psVar1->SecActTarget)->super_AActor;
    obj = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
          &((this->super_AActor).Sector)->SecActTarget;
    while ((pAVar2 != (AActor *)0x0 && (pAVar2 != &this->super_AActor))) {
      obj = &(pAVar2->tracer).field_0;
      pAVar2 = GC::ReadBarrier<AActor>(&obj->p);
    }
    if (pAVar2 != (AActor *)0x0) {
      TVar3.field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
           GC::ReadBarrier<AActor>((AActor **)&pAVar2->tracer);
      obj->p = (AActor *)TVar3.field_0;
    }
    (this->super_AActor).Sector = (sector_t *)0x0;
  }
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ASectorAction::Destroy ()
{
	if (Sector != nullptr)
	{
		// Remove ourself from this sector's list of actions
		AActor *probe = Sector->SecActTarget;
		union
		{
			AActor **act;
			ASectorAction **secact;
		} prev;
		prev.secact = &Sector->SecActTarget;

		while (probe && probe != this)
		{
			prev.act = &probe->tracer;
			probe = probe->tracer;
		}
		if (probe != nullptr)
		{
			*prev.act = probe->tracer;
		}
		Sector = nullptr;
	}

	Super::Destroy ();
}